

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void pbrt::syntactic::Attributes::push(SP *current)

{
  element_type *peVar1;
  __shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  shared_ptr<pbrt::syntactic::Attributes> *in_stack_00000018;
  shared_ptr<pbrt::syntactic::Attributes> *in_stack_ffffffffffffffe8;
  shared_ptr<pbrt::syntactic::Attributes> *in_stack_fffffffffffffff0;
  
  peVar1 = std::__shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>::get(in_RDI);
  if (peVar1 == (element_type *)0x0) {
    std::make_shared<pbrt::syntactic::Attributes>();
  }
  else {
    std::make_shared<pbrt::syntactic::Attributes,std::shared_ptr<pbrt::syntactic::Attributes>&>
              (in_stack_00000018);
  }
  std::shared_ptr<pbrt::syntactic::Attributes>::operator=
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  std::shared_ptr<pbrt::syntactic::Attributes>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Attributes> *)0x184105);
  return;
}

Assistant:

static void push(Attributes::SP &current) {
        // Attributes::SP newGraphicsState = std::make_shared<Attributes>();
        // newGraphicsState->areaLightSources = graphicsState->areaLightSources;
        // newGraphicsState->mediumInterface = graphicsState->mediumInterface;
        // newGraphicsState->reverseOrientation = graphicsState->reverseOrientation;
        // newGraphicsState->parent = graphicsState;
        // graphicsState = newGraphicsState;
        current 
          = current.get()
          ? std::make_shared<Attributes>(current)
          : std::make_shared<Attributes>();
      }